

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

int tcache_create_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                     size_t newlen)

{
  ulong uVar1;
  _Bool _Var2;
  int iVar3;
  base_t *base;
  size_t __n;
  uint local_1c;
  
  iVar3 = 1;
  if (newp == (void *)0x0 && newlen == 0) {
    if ((oldlenp == (size_t *)0x0 || oldp == (void *)0x0) || (*oldlenp != 4)) {
      iVar3 = 0x16;
      if (oldlenp != (size_t *)0x0) {
        *oldlenp = 0;
      }
    }
    else {
      base = duckdb_je_b0get();
      _Var2 = duckdb_je_tcaches_create(tsd,base,&local_1c);
      iVar3 = 0xe;
      if (!_Var2) {
        uVar1 = *oldlenp;
        if (uVar1 == 4) {
          *(uint *)oldp = local_1c;
          iVar3 = 0;
        }
        else {
          __n = 4;
          if (uVar1 < 4) {
            __n = uVar1;
          }
          switchD_012dd528::default(oldp,&local_1c,__n);
          *oldlenp = __n;
          iVar3 = 0x16;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int
tcache_create_ctl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	unsigned tcache_ind;

	READONLY();
	VERIFY_READ(unsigned);
	if (tcaches_create(tsd, b0get(), &tcache_ind)) {
		ret = EFAULT;
		goto label_return;
	}
	READ(tcache_ind, unsigned);

	ret = 0;
label_return:
	return ret;
}